

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fec-group.c
# Opt level: O1

int fec_group_decode(fec_group_t *group)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  uint *puVar4;
  gf *pkts;
  long lVar5;
  int iVar6;
  fec_t *fec;
  uint uVar7;
  ulong uVar8;
  undefined8 uStack_30;
  
  if (group == (fec_group_t *)0x0) {
    uStack_30 = 0x107c09;
    __assert_fail("group != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/fec-group.c",0x88,
                  "int fec_group_decode(fec_group_t *)");
  }
  uVar7 = 1;
  if (group->decoded == 0) {
    uVar7 = 0;
    if (group->fec_k <= group->rcvd_pkts) {
      lVar5 = -(ulong)((uint)group->fec_k * 4 + 0xf & 0xfffffff0);
      bVar1 = group->fec_n;
      if (bVar1 == 0) {
        uVar7 = 0;
      }
      else {
        puVar4 = group->lengths;
        uVar8 = 0;
        uVar7 = 0;
        do {
          if (puVar4[uVar8] != 0) {
            *(uint *)((long)(&stack0xffffffffffffffd8 + lVar5) + (long)(int)uVar7 * 4) = (uint)uVar8
            ;
            uVar7 = uVar7 + 1;
            if (uVar7 == group->fec_k) break;
          }
          uVar8 = uVar8 + 1;
        } while ((uint)bVar1 != uVar8);
      }
      bVar2 = group->fec_k;
      if (uVar7 != bVar2) {
        *(undefined8 *)((long)&uStack_30 + lVar5) = 0x107c28;
        __assert_fail("j == group->fec_k",
                      "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/fec-group.c",
                      0x9f,"int fec_group_decode(fec_group_t *)");
      }
      *(undefined8 *)((long)&uStack_30 + lVar5) = 0x107b9a;
      fec = fec_new((uint)bVar2,(uint)bVar1);
      if (fec == (fec_t *)0x0) {
        *(code **)((long)&uStack_30 + lVar5) = fec_group_decode_to_adus;
        __assert_fail("fec != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/fec-group.c",
                      0xa3,"int fec_group_decode(fec_group_t *)");
      }
      pkts = group->buf;
      uVar3 = group->fec_len;
      *(undefined8 *)((long)&uStack_30 + lVar5) = 0x107bb9;
      iVar6 = fec_decode(fec,pkts,(uint *)(&stack0xffffffffffffffd8 + lVar5),(uint)uVar3);
      if (iVar6 == 0) {
        *(undefined8 *)((long)&uStack_30 + lVar5) = 0x107be6;
        fec_group_decode_cold_1();
      }
      else {
        *(undefined8 *)((long)&uStack_30 + lVar5) = 0x107bc5;
        fec_free(fec);
        group->decoded = 1;
      }
      uVar7 = (uint)(iVar6 != 0);
    }
  }
  return uVar7;
}

Assistant:

int fec_group_decode(fec_group_t *group) {
  assert(group != NULL);
  
  if (group->decoded)
    return 1;
  
  /* check if enough packets in the group have been received to
   * recover the complete source data.
   */
  if (group->rcvd_pkts >= group->fec_k) {
    /* we have enough packets in the fec group */
    unsigned int idxs[group->fec_k];

    /* create index array and pointer array. */
    int i, j;
    for (i = 0, j = 0; i < group->fec_n; i++) {
      if (group->lengths[i] > 0) {
        idxs[j] = i;
        j++;
        if (j == group->fec_k)
          break;
      }
    }

    assert(j == group->fec_k);

    /* create the fec structure. */
    fec_t *fec = fec_new(group->fec_k, group->fec_n);
    assert(fec != NULL);

    /* decode the fec group. */
    if (!fec_decode(fec, group->buf, idxs, group->fec_len)) {
      fprintf(stderr, "Could not decode FEC group\n");
      fec_free(fec);
      return 0;
    }

    fec_free(fec);

    group->decoded = 1;

    return 1;
  }  else {
    return 0;
  }
}